

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffitab(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,int tfields,char **ttype,long *tbcol,
          char **tform,char **tunit,char *extnmx,int *status)

{
  int iVar1;
  int iVar2;
  LONGLONG LVar3;
  LONGLONG *pLVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  FITSfile *pFVar9;
  int iVar10;
  size_t __nmemb;
  bool bVar11;
  bool bVar12;
  long *local_f8;
  char extnm [71];
  long rowlen;
  
  if (0 < *status) {
    return *status;
  }
  extnm[0] = '\0';
  if (extnmx != (char *)0x0) {
    strncat(extnm,extnmx,0x46);
  }
  iVar10 = fptr->HDUposition;
  pFVar9 = fptr->Fptr;
  if (iVar10 != pFVar9->curhdu) {
    ffmahd(fptr,iVar10 + 1,(int *)0x0,status);
    pFVar9 = fptr->Fptr;
    iVar10 = pFVar9->curhdu;
  }
  if ((pFVar9->headend == pFVar9->headstart[iVar10]) ||
     ((iVar10 == pFVar9->maxhdu && (pFVar9->logfilesize <= pFVar9->headstart[(long)iVar10 + 1])))) {
    ffcrtb(fptr,1,naxis2,tfields,ttype,tform,tunit,extnm,status);
  }
  else {
    if (naxis1 < 0) {
      *status = 0xd9;
      return 0xd9;
    }
    if (naxis2 < 0) {
      *status = 0xda;
      return 0xda;
    }
    if (999 < (uint)tfields) {
      snprintf((char *)&rowlen,0x51,"Illegal value for TFIELDS keyword: %d",(ulong)(uint)tfields);
      ffpmsg((char *)&rowlen);
      *status = 0xd8;
      return 0xd8;
    }
    if (tfields == 0) {
      iVar10 = 0;
    }
    else {
      uVar8 = 0;
      iVar10 = 0;
      do {
        if ((tunit != (char **)0x0) && (*tunit != (char *)0x0)) {
          iVar10 = (iVar10 + 1) - (uint)(*tunit[uVar8] == '\0');
        }
        uVar8 = uVar8 + 1;
      } while ((uint)tfields != uVar8);
    }
    bVar11 = extnm[0] != '\0';
    rowlen = naxis1;
    if (((tbcol == (long *)0x0) || (*tbcol == 0)) ||
       (bVar12 = true, local_f8 = tbcol, tfields != 0 && naxis1 == 0)) {
      __nmemb = 5;
      if (5 < tfields) {
        __nmemb = (size_t)(uint)tfields;
      }
      local_f8 = (long *)calloc(__nmemb,8);
      bVar12 = local_f8 == (long *)0x0;
      if (bVar12) {
        local_f8 = (long *)0x0;
      }
      else {
        ffgabc(tfields,tform,1,&rowlen,local_f8,status);
        pFVar9 = fptr->Fptr;
      }
    }
    if (pFVar9->writemode != 1) {
      *status = 0x70;
      return 0x70;
    }
    lVar7 = rowlen * naxis2;
    iVar5 = (int)(tfields * 3 + iVar10 + (uint)bVar11 + 0x2c) / 0x24;
    ffrdef(fptr,status);
    ffpdfl(fptr,status);
    pFVar9 = fptr->Fptr;
    iVar10 = pFVar9->curhdu;
    LVar3 = pFVar9->headstart[(long)iVar10 + 1];
    pFVar9->hdutype = 1;
    iVar6 = ffiblk(fptr,(long)iVar5 + (lVar7 + 0xb3f) / 0xb40,1,status);
    if (0 < iVar6) {
      if (!bVar12) {
        free(local_f8);
      }
      return *status;
    }
    pFVar9 = fptr->Fptr;
    iVar1 = pFVar9->maxhdu;
    iVar6 = iVar1 + 1;
    pFVar9->maxhdu = iVar6;
    iVar2 = pFVar9->curhdu;
    pLVar4 = pFVar9->headstart;
    if (iVar2 <= iVar1) {
      lVar7 = (long)iVar6;
      do {
        pLVar4[lVar7 + 1] = pLVar4[lVar7];
        lVar7 = lVar7 + -1;
      } while (iVar2 < lVar7);
    }
    pLVar4[(long)iVar10 + 1] = LVar3;
    pFVar9->curhdu = iVar10 + 1;
    fptr->HDUposition = iVar10 + 1;
    pFVar9->nextkey = LVar3;
    lVar7 = pLVar4[(long)iVar10 + 1];
    pFVar9->headend = lVar7;
    pFVar9->datastart = iVar5 * 0xb40 + lVar7;
    pFVar9->hdutype = 1;
    ffphtb(fptr,rowlen,naxis2,tfields,ttype,local_f8,tform,tunit,extnm,status);
    if (!bVar12) {
      free(local_f8);
    }
    ffrdef(fptr,status);
  }
  return *status;
}

Assistant:

int ffitab(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of row in the table                */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           long *tbcol,     /* I - byte offset in row to each column        */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  insert an ASCII table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, ncols, gotmem = 0;
    long nblocks, rowlen;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, ASCII_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis1 < 0)
        return(*status = NEG_WIDTH);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    rowlen = (long) naxis1;

    if (!tbcol || !tbcol[0] || (!naxis1 && tfields)) /* spacing not defined? */
    {
      /* allocate mem for tbcol; malloc may have problems allocating small */
      /* arrays, so allocate at least 20 bytes */

      ncols = maxvalue(5, tfields);
      tbcol = (long *) calloc(ncols, sizeof(long));

      if (tbcol)
      {
        gotmem = 1;

        /* calculate width of a row and starting position of each column. */
        /* Each column will be separated by 1 blank space */
        ffgabc(tfields, tform, 1, &rowlen, tbcol, status);
      }
    }

    nhead = (9 + (3 * tfields) + nunit + 35) / 36;  /* no. of header blocks */
    datasize = (LONGLONG)rowlen * naxis2;          /* size of table in bytes */
    nblocks = (long) (((datasize + 2879) / 2880) + nhead);  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* so that correct fill value is used */
    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
    {
        if (gotmem)
            free(tbcol); 
        return(*status);
    }

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = ASCII_TBL;  /* might need to be reset... */

    /* write the required header keywords */

    ffphtb(fptr, rowlen, naxis2, tfields, ttype, tbcol, tform, tunit,
           extnm, status);

    if (gotmem)
        free(tbcol); 

    /* redefine internal structure for this HDU */

    ffrdef(fptr, status);
    return(*status);
}